

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

Arg * __thiscall
fmt::BasicFormatter<char>::parse_arg_name
          (Arg *__return_storage_ptr__,BasicFormatter<char> *this,char **s)

{
  long lVar1;
  bool bVar2;
  FormatError *this_00;
  bool local_72;
  CStringRef local_48;
  BasicStringRef<char> local_40;
  char *local_30;
  char *error;
  char *pcStack_20;
  char c;
  char *start;
  char **s_local;
  BasicFormatter<char> *this_local;
  
  start = (char *)s;
  s_local = (char **)this;
  bVar2 = anon_unknown_1::is_name_start<char>(**s);
  if (!bVar2) {
    __assert_fail("is_name_start(*s)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/cppformat/cppformat/format.cc"
                  ,0x36f,
                  "Arg fmt::BasicFormatter<char>::parse_arg_name(const Char *&) [Char = char]");
  }
  pcStack_20 = *(char **)start;
  do {
    lVar1 = *(long *)start;
    *(long *)start = lVar1 + 1;
    error._7_1_ = *(char *)(lVar1 + 1);
    bVar2 = anon_unknown_1::is_name_start<char>(error._7_1_);
    local_72 = true;
    if (!bVar2) {
      local_72 = '/' < error._7_1_ && error._7_1_ < ':';
    }
  } while (local_72);
  local_30 = (char *)0x0;
  BasicStringRef<char>::BasicStringRef(&local_40,pcStack_20,*(long *)start - (long)pcStack_20);
  get_arg(__return_storage_ptr__,this,local_40,&local_30);
  if (local_30 != (char *)0x0) {
    this_00 = (FormatError *)__cxa_allocate_exception(0x10);
    BasicCStringRef<char>::BasicCStringRef(&local_48,local_30);
    FormatError::FormatError(this_00,local_48);
    __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Arg fmt::BasicFormatter<Char>::parse_arg_name(const Char *&s) {
  assert(is_name_start(*s));
  const Char *start = s;
  Char c;
  do {
    c = *++s;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  const char *error = 0;
  Arg arg = get_arg(fmt::BasicStringRef<Char>(start, s - start), error);
  if (error)
    FMT_THROW(fmt::FormatError(error));
  return arg;
}